

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall
btQuantizedBvh::walkStacklessTree
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  int *piVar1;
  bool bVar2;
  btOptimizedBvhNode *aabbMax2;
  btVector3 *in_RCX;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  long in_RDI;
  bool bVar3;
  uint aabbOverlap;
  bool isLeafNode;
  int walkIterations;
  int curIndex;
  int escapeIndex;
  btOptimizedBvhNode *rootNode;
  int local_34;
  int local_30;
  
  aabbMax2 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),0);
  local_30 = 0;
  local_34 = 0;
  while (local_30 < *(int *)(in_RDI + 0x3c)) {
    local_34 = local_34 + 1;
    bVar2 = TestAabbAgainstAabb2(in_RSI,in_RDX,in_RCX,&aabbMax2->m_aabbMinOrg);
    bVar3 = aabbMax2->m_escapeIndex == -1;
    if ((bVar3) && (bVar2)) {
      (**(code **)(*(long *)in_RSI->m_floats + 0x10))
                (in_RSI,aabbMax2->m_subPart,aabbMax2->m_triangleIndex);
    }
    if ((bVar2) || (bVar3)) {
      aabbMax2 = aabbMax2 + 1;
      local_30 = local_30 + 1;
    }
    else {
      piVar1 = &aabbMax2->m_escapeIndex;
      aabbMax2 = aabbMax2 + *piVar1;
      local_30 = *piVar1 + local_30;
    }
  }
  if (maxIterations < local_34) {
    maxIterations = local_34;
  }
  return;
}

Assistant:

void	btQuantizedBvh::walkStacklessTree(btNodeOverlapCallback* nodeCallback,const btVector3& aabbMin,const btVector3& aabbMax) const
{
	btAssert(!m_useQuantization);

	const btOptimizedBvhNode* rootNode = &m_contiguousNodes[0];
	int escapeIndex, curIndex = 0;
	int walkIterations = 0;
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	while (curIndex < m_curNodeIndex)
	{
		//catch bugs in tree data
		btAssert (walkIterations < m_curNodeIndex);

		walkIterations++;
		aabbOverlap = TestAabbAgainstAabb2(aabbMin,aabbMax,rootNode->m_aabbMinOrg,rootNode->m_aabbMaxOrg);
		isLeafNode = rootNode->m_escapeIndex == -1;
		
		//PCK: unsigned instead of bool
		if (isLeafNode && (aabbOverlap != 0))
		{
			nodeCallback->processNode(rootNode->m_subPart,rootNode->m_triangleIndex);
		} 
		
		//PCK: unsigned instead of bool
		if ((aabbOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		} else
		{
			escapeIndex = rootNode->m_escapeIndex;
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;

}